

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_compress.c
# Opt level: O2

void deflate_set_costs_from_codes(libdeflate_compressor *c,deflate_lens *lens)

{
  long lVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  
  for (lVar1 = 0; lVar1 != 0x100; lVar1 = lVar1 + 1) {
    iVar3 = (uint)lens->litlen[lVar1] << 4;
    if (lens->litlen[lVar1] == 0) {
      iVar3 = 0xd0;
    }
    *(int *)((long)&c->p + lVar1 * 4 + 0x88d0c4) = iVar3;
  }
  for (lVar1 = 0; lVar1 != 0x100; lVar1 = lVar1 + 1) {
    uVar4 = 0xd;
    if (lens->offset[(ulong)""[lVar1 + 3] - 0x1f] != 0) {
      uVar4 = (uint)lens->offset[(ulong)""[lVar1 + 3] - 0x1f];
    }
    *(uint *)((long)&c->p + lVar1 * 4 + 0x88d4d0) = (""[""[lVar1 + 3]] + uVar4) * 0x10;
  }
  for (lVar1 = 0; lVar1 != 0x1e; lVar1 = lVar1 + 1) {
    bVar2 = lens->offset[lVar1];
    if (bVar2 == 0) {
      bVar2 = 10;
    }
    *(uint *)((long)&c->p + lVar1 * 4 + 0x88d8d0) = ((uint)""[lVar1] + (uint)bVar2) * 0x10;
  }
  return;
}

Assistant:

static void
deflate_set_costs_from_codes(struct libdeflate_compressor *c,
			     const struct deflate_lens *lens)
{
	unsigned i;

	/* Literals */
	for (i = 0; i < DEFLATE_NUM_LITERALS; i++) {
		u32 bits = (lens->litlen[i] ?
			    lens->litlen[i] : LITERAL_NOSTAT_BITS);

		c->p.n.costs.literal[i] = bits * BIT_COST;
	}

	/* Lengths */
	for (i = DEFLATE_MIN_MATCH_LEN; i <= DEFLATE_MAX_MATCH_LEN; i++) {
		unsigned length_slot = deflate_length_slot[i];
		unsigned litlen_sym = DEFLATE_FIRST_LEN_SYM + length_slot;
		u32 bits = (lens->litlen[litlen_sym] ?
			    lens->litlen[litlen_sym] : LENGTH_NOSTAT_BITS);

		bits += deflate_extra_length_bits[length_slot];
		c->p.n.costs.length[i] = bits * BIT_COST;
	}

	/* Offset slots */
	for (i = 0; i < ARRAY_LEN(deflate_offset_slot_base); i++) {
		u32 bits = (lens->offset[i] ?
			    lens->offset[i] : OFFSET_NOSTAT_BITS);

		bits += deflate_extra_offset_bits[i];
		c->p.n.costs.offset_slot[i] = bits * BIT_COST;
	}
}